

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

string * common_token_to_piece_abi_cxx11_
                   (string *__return_storage_ptr__,llama_vocab *vocab,llama_token token,bool special
                   )

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  iVar1 = llama_token_to_piece
                    (vocab,token,(__return_storage_ptr__->_M_dataplus)._M_p,
                     (int)__return_storage_ptr__->_M_string_length,0,special);
  if (iVar1 < 0) {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    iVar2 = llama_token_to_piece
                      (vocab,token,(__return_storage_ptr__->_M_dataplus)._M_p,
                       (int)__return_storage_ptr__->_M_string_length,0,special);
    if (iVar2 != -iVar1) {
      uVar3 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/common.cpp"
                         ,0x4fe,"GGML_ASSERT(%s) failed","check == -n_chars");
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      _Unwind_Resume(uVar3);
    }
  }
  else {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string common_token_to_piece(const struct llama_vocab * vocab, llama_token token, bool special) {
    std::string piece;
    piece.resize(piece.capacity());  // using string internal cache, 15 bytes + '\n'
    const int n_chars = llama_token_to_piece(vocab, token, &piece[0], piece.size(), 0, special);
    if (n_chars < 0) {
        piece.resize(-n_chars);
        int check = llama_token_to_piece(vocab, token, &piece[0], piece.size(), 0, special);
        GGML_ASSERT(check == -n_chars);
    }
    else {
        piece.resize(n_chars);
    }

    return piece;
}